

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_MessageSetMember *
upb_test_MessageSetMember_message_set_extension(upb_test_TestMessageSet *msg)

{
  upb_test_MessageSetMember *ret;
  upb_test_MessageSetMember *default_val;
  upb_test_MessageSetMember *local_18;
  undefined8 local_10;
  
  if ((upb_test_MessageSetMember_message_set_extension_ext.field_dont_copy_me__upb_internal_use_only
       .mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                  ,0xd0a,
                  "const upb_test_MessageSetMember *upb_test_MessageSetMember_message_set_extension(const struct upb_test_TestMessageSet *)"
                 );
  }
  if (0xbf < upb_test_MessageSetMember_message_set_extension_ext.
             field_dont_copy_me__upb_internal_use_only.mode_dont_copy_me__upb_internal_use_only) {
    local_10 = 0;
    _upb_Message_GetExtensionField
              (&msg->base_dont_copy_me__upb_internal_use_only,
               &upb_test_MessageSetMember_message_set_extension_ext,&local_10,&local_18);
    return local_18;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/message/test.upb.h"
                ,0xd0c,
                "const upb_test_MessageSetMember *upb_test_MessageSetMember_message_set_extension(const struct upb_test_TestMessageSet *)"
               );
}

Assistant:

UPB_INLINE upb_test_TestExtensions* upb_test_TestExtensions_parse_ex(const char* buf, size_t size,
                           const upb_ExtensionRegistry* extreg,
                           int options, upb_Arena* arena) {
  upb_test_TestExtensions* ret = upb_test_TestExtensions_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &upb_0test__TestExtensions_msg_init, extreg, options,
                 arena) != kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}